

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_dictionary.hpp
# Opt level: O1

primitive_dictionary_entry_t * __thiscall
duckdb::PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator>::Lookup
          (PrimitiveDictionary<duckdb::float_na_equal,_float,_duckdb::FloatingPointOperator> *this,
          float_na_equal *value)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  primitive_dictionary_entry_t *ppVar4;
  uint uVar5;
  
  uVar5 = -(uint)NAN(*(float *)value);
  uVar3 = duckdb::Hash<float>((float)(~uVar5 & (uint)*(float *)value | uVar5 & 0x7fc00000));
  uVar3 = uVar3 & this->capacity_mask;
  ppVar4 = this->dictionary + uVar3;
  if (ppVar4->index != 0xffffffff) {
    fVar1 = *(float *)value;
    do {
      fVar2 = *(float *)ppVar4;
      if (NAN(fVar2) && NAN(fVar1)) {
        return ppVar4;
      }
      if ((fVar2 == fVar1) && (!NAN(fVar2) && !NAN(fVar1))) {
        return ppVar4;
      }
      uVar3 = uVar3 + 1 & this->capacity_mask;
      ppVar4 = this->dictionary + uVar3;
    } while (ppVar4->index != 0xffffffff);
  }
  return ppVar4;
}

Assistant:

primitive_dictionary_entry_t &Lookup(const SRC &value) const {
		auto offset = Hash(value) & capacity_mask;
		while (!dictionary[offset].IsEmpty() && dictionary[offset].value != value) {
			++offset &= capacity_mask;
		}
		return dictionary[offset];
	}